

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_loader.c
# Opt level: O0

_Bool load_rom(char *rom_filename,_Bool debug_enabled)

{
  _Bool _Var1;
  iNES_1_0_header header;
  byte bStack_1a;
  iNES_1_0_header parsed_header;
  _Bool debug_enabled_local;
  char *rom_filename_local;
  
  _Var1 = read_rom(rom_filename);
  if (_Var1) {
    rom_filename_local._7_1_ = true;
  }
  else {
    header = get_iNes_1_0_header();
    print_iNes_1_0_header(header);
    bStack_1a = header.mapper;
    if (bStack_1a == 0) {
      init_NROM();
      if (debug_enabled) {
        print_rom_data();
      }
      rom_filename_local._7_1_ = false;
    }
    else {
      printf("ERROR: Mapper %u does not match any supported mappers\n",(ulong)bStack_1a);
      rom_filename_local._7_1_ = true;
    }
  }
  return rom_filename_local._7_1_;
}

Assistant:

bool load_rom(const char* rom_filename, bool debug_enabled) {
    if(read_rom(rom_filename)) {
        return true;
    }

    iNES_1_0_header parsed_header = get_iNes_1_0_header();
    print_iNes_1_0_header(parsed_header);
    switch(parsed_header.mapper) {
        case 0:
            init_NROM();
            break;
        default:
            printf("ERROR: Mapper %u does not match any supported mappers\n", parsed_header.mapper);
            return true;
    }

    if(debug_enabled) {
        print_rom_data();
    }
    return false;
}